

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpFactory.cpp
# Opt level: O2

ChildOp * __thiscall xercesc_4_0::OpFactory::createNonGreedyClosureOp(OpFactory *this)

{
  ChildOp *this_00;
  
  this_00 = (ChildOp *)XMemory::operator_new(0x28,this->fMemoryManager);
  ChildOp::ChildOp(this_00,O_NONGREEDYCLOSURE,this->fMemoryManager);
  BaseRefVectorOf<xercesc_4_0::Op>::addElement
            (&this->fOpVector->super_BaseRefVectorOf<xercesc_4_0::Op>,(Op *)this_00);
  return this_00;
}

Assistant:

ChildOp* OpFactory::createNonGreedyClosureOp() {

    ChildOp* tmpOp = new (fMemoryManager) ChildOp(Op::O_NONGREEDYCLOSURE, fMemoryManager);

    fOpVector->addElement(tmpOp);
    return tmpOp;
}